

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall r_code::LObject::set_reference(LObject *this,uint16_t i,Code *object)

{
  atomic_int_fast64_t *paVar1;
  Code *pCVar2;
  P<r_code::Code> *pPVar3;
  undefined6 in_register_00000032;
  
  pPVar3 = vector<core::P<r_code::Code>_>::operator[]
                     (&this->_references,CONCAT62(in_register_00000032,i) & 0xffffffff);
  pCVar2 = (Code *)pPVar3->object;
  if (pCVar2 != object) {
    if (pCVar2 != (Code *)0x0) {
      LOCK();
      paVar1 = &(pCVar2->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pCVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(pCVar2->super__Object)._vptr__Object[1])();
      }
    }
    pPVar3->object = &object->super__Object;
    if (object != (Code *)0x0) {
      LOCK();
      paVar1 = &(object->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void set_reference(uint16_t i, Code *object)
    {
        _references[i] = object;
    }